

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

L2NormalizeLayerParams * __thiscall
CoreML::Specification::L2NormalizeLayerParams::New(L2NormalizeLayerParams *this,Arena *arena)

{
  L2NormalizeLayerParams *this_00;
  L2NormalizeLayerParams *n;
  Arena *arena_local;
  L2NormalizeLayerParams *this_local;
  
  this_00 = (L2NormalizeLayerParams *)operator_new(0x18);
  L2NormalizeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::L2NormalizeLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

L2NormalizeLayerParams* L2NormalizeLayerParams::New(::google::protobuf::Arena* arena) const {
  L2NormalizeLayerParams* n = new L2NormalizeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}